

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FState **state,FState **def,bool *retcode)

{
  FWriter *this;
  FState *pFVar1;
  bool bVar2;
  uint uVar3;
  Value *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_02;
  Ch *pCVar4;
  char *pcVar5;
  PClassActor *pPVar6;
  bool local_61;
  PClassActor *clas;
  Value *ndx;
  Value *cls;
  Value *val;
  PClassActor *info;
  bool *retcode_local;
  FState **def_local;
  FState **state_local;
  char *key_local;
  FSerializer *arc_local;
  
  if (retcode != (bool *)0x0) {
    *retcode = false;
  }
  bVar2 = FSerializer::isWriting(arc);
  if (bVar2) {
    bVar2 = FWriter::inObject(arc->w);
    if (((!bVar2) || (def == (FState **)0x0)) || (*state != *def)) {
      if (retcode != (bool *)0x0) {
        *retcode = true;
      }
      FSerializer::WriteKey(arc,key);
      if (*state == (FState *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        pPVar6 = FState::StaticFindStateOwner(*state);
        if (pPVar6 == (PClassActor *)0x0) {
          FWriter::Null(arc->w);
        }
        else {
          FWriter::StartArray(arc->w);
          this = arc->w;
          pcVar5 = FName::GetChars(&(pPVar6->super_PClass).super_PNativeStruct.super_PStruct.
                                    super_PNamedType.TypeName);
          FWriter::String(this,pcVar5);
          FWriter::Uint(arc->w,(uint32_t)(((long)*state - (long)pPVar6->OwnedStates) / 0x28));
          FWriter::EndArray(arc->w);
        }
      }
    }
  }
  else {
    this_00 = FReader::FindKey(arc->r,key);
    if (this_00 != (Value *)0x0) {
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this_00);
      if (bVar2) {
        if (retcode != (bool *)0x0) {
          *retcode = true;
        }
        *state = (FState *)0x0;
      }
      else {
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsArray(this_00);
        if (bVar2) {
          if (retcode != (bool *)0x0) {
            *retcode = true;
          }
          this_01 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::operator[](this_00,0);
          this_02 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::operator[](this_00,1);
          *state = (FState *)0x0;
          bVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsString(this_01);
          local_61 = false;
          if (bVar2) {
            local_61 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::IsUint(this_02);
          }
          if (local_61 == false) {
            __assert_fail("cls.IsString() && ndx.IsUint()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x79e,
                          "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                         );
          }
          bVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsString(this_01);
          if ((!bVar2) ||
             (bVar2 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::IsUint(this_02), !bVar2)) {
            __assert_fail("false && \"not a state\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x7af,
                          "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                         );
          }
          pCVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(this_01);
          pcVar5 = UnicodeToString(pCVar4);
          pPVar6 = PClass::FindActor(pcVar5);
          if ((pPVar6 == (PClassActor *)0x0) ||
             (uVar3 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetUint(this_02), (uint)pPVar6->NumOwnedStates <= uVar3)) {
            *state = (FState *)0x0;
            pCVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(this_01);
            uVar3 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetInt(this_02);
            Printf("\x1cIInvalid state \'%s+%d\' for \'%s\'",pCVar4,(ulong)uVar3,key);
          }
          else {
            pFVar1 = pPVar6->OwnedStates;
            uVar3 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(this_02);
            *state = pFVar1 + uVar3;
          }
        }
        else if (retcode == (bool *)0x0) {
          __assert_fail("false && \"not an array\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x7b6,
                        "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                       );
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FState *&state, FState **def, bool *retcode)
{
	if (retcode) *retcode = false;
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || state != *def)
		{
			if (retcode) *retcode = true;
			arc.WriteKey(key);
			if (state == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				PClassActor *info = FState::StaticFindStateOwner(state);

				if (info != NULL)
				{
					arc.w->StartArray();
					arc.w->String(info->TypeName.GetChars());
					arc.w->Uint((uint32_t)(state - info->OwnedStates));
					arc.w->EndArray();
				}
				else
				{
					arc.w->Null();
				}
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				if (retcode) *retcode = true;
				state = nullptr;
			}
			else if (val->IsArray())
			{
				if (retcode) *retcode = true;
				const rapidjson::Value &cls = (*val)[0];
				const rapidjson::Value &ndx = (*val)[1];

				state = nullptr;
				assert(cls.IsString() && ndx.IsUint());
				if (cls.IsString() && ndx.IsUint())
				{
					PClassActor *clas = PClass::FindActor(UnicodeToString(cls.GetString()));
					if (clas && ndx.GetUint() < (unsigned)clas->NumOwnedStates)
					{
						state = clas->OwnedStates + ndx.GetUint();
					}
					else
					{
						// this can actually happen by changing the DECORATE so treat it as a warning, not an error.
						state = nullptr;
						Printf(TEXTCOLOR_ORANGE "Invalid state '%s+%d' for '%s'", cls.GetString(), ndx.GetInt(), key);
					}
				}
				else
				{
					assert(false && "not a state");
					Printf(TEXTCOLOR_RED "data does not represent a state for '%s'", key);
					arc.mErrors++;
				}
			}
			else if (!retcode)
			{
				assert(false && "not an array");
				Printf(TEXTCOLOR_RED "array type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;

}